

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NetAliasSymbol * __thiscall
slang::BumpAllocator::emplace<slang::ast::NetAliasSymbol,slang::SourceLocation>
          (BumpAllocator *this,SourceLocation *args)

{
  SourceLocation SVar1;
  NetAliasSymbol *pNVar2;
  
  pNVar2 = (NetAliasSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NetAliasSymbol *)this->endPtr < pNVar2 + 1) {
    pNVar2 = (NetAliasSymbol *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pNVar2 + 1);
  }
  SVar1 = *args;
  (pNVar2->super_Symbol).kind = NetAlias;
  (pNVar2->super_Symbol).name._M_len = 0;
  (pNVar2->super_Symbol).name._M_str = "";
  (pNVar2->super_Symbol).location = SVar1;
  (pNVar2->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (pNVar2->super_Symbol).parentScope = (Scope *)0x0;
  (pNVar2->super_Symbol).nextInScope = (Symbol *)0x0;
  (pNVar2->super_Symbol).indexInScope = 0;
  (pNVar2->netRefs).
  super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  ._M_engaged = false;
  return pNVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }